

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_2ddrawer.cpp
# Opt level: O2

void __thiscall
F2DDrawer::AddDim(F2DDrawer *this,PalEntry color,float damount,int x1,int y1,int w,int h)

{
  FSimpleVertex *pFVar1;
  uint uVar2;
  DataGeneric dg;
  
  dg.mType = DrawTypeDim;
  dg.mLen = 0x10;
  dg.mVertCount = 4;
  dg.mVertIndex = TArray<FSimpleVertex,_FSimpleVertex>::Reserve(&this->mVertices,4);
  pFVar1 = (this->mVertices).Array;
  pFVar1[dg.mVertIndex].x = (float)x1;
  pFVar1[dg.mVertIndex].z = (float)y1;
  pFVar1[dg.mVertIndex].y = 0.0;
  pFVar1[dg.mVertIndex].u = 0.0;
  pFVar1[dg.mVertIndex].v = 0.0;
  uVar2 = (uint)color.field_0 >> 0x10 & 0xff |
          (uint)color.field_0 & 0xff00 |
          ((uint)color.field_0 & 0xff) << 0x10 | (int)(damount * 255.0) << 0x18;
  pFVar1[dg.mVertIndex].color.field_0.d = uVar2;
  pFVar1[(long)dg.mVertIndex + 1].x = (float)x1;
  pFVar1[(long)dg.mVertIndex + 1].z = (float)(h + y1);
  pFVar1[(long)dg.mVertIndex + 1].y = 0.0;
  pFVar1[(long)dg.mVertIndex + 1].u = 0.0;
  pFVar1[(long)dg.mVertIndex + 1].v = 0.0;
  pFVar1[(long)dg.mVertIndex + 1].color.field_0.d = uVar2;
  pFVar1[(long)dg.mVertIndex + 2].x = (float)(w + x1);
  pFVar1[(long)dg.mVertIndex + 2].z = (float)(h + y1);
  pFVar1[(long)dg.mVertIndex + 2].y = 0.0;
  pFVar1[(long)dg.mVertIndex + 2].u = 0.0;
  pFVar1[(long)dg.mVertIndex + 2].v = 0.0;
  pFVar1[(long)dg.mVertIndex + 2].color.field_0.d = uVar2;
  pFVar1[(long)dg.mVertIndex + 3].x = (float)(w + x1);
  pFVar1[(long)dg.mVertIndex + 3].z = (float)y1;
  pFVar1[(long)dg.mVertIndex + 3].y = 0.0;
  pFVar1[(long)dg.mVertIndex + 3].u = 0.0;
  pFVar1[(long)dg.mVertIndex + 3].v = 0.0;
  pFVar1[(long)dg.mVertIndex + 3].color.field_0.d = uVar2;
  AddData(this,&dg);
  return;
}

Assistant:

void F2DDrawer::AddDim(PalEntry color, float damount, int x1, int y1, int w, int h)
{
	color.a = uint8_t(damount * 255);
	std::swap(color.r, color.b);

	DataGeneric dg;

	dg.mType = DrawTypeDim;
	dg.mLen = (sizeof(dg) + 7) & ~7;
	dg.mVertCount = 4;
	dg.mVertIndex = (int)mVertices.Reserve(4);
	FSimpleVertex *ptr = &mVertices[dg.mVertIndex];
	ptr->Set(x1, y1, 0, 0, 0, color); ptr++;
	ptr->Set(x1, y1 + h, 0, 0, 0, color); ptr++;
	ptr->Set(x1 + w, y1 + h, 0, 0, 0, color); ptr++;
	ptr->Set(x1 + w, y1, 0, 0, 0, color); ptr++;
	AddData(&dg);
}